

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

D_ParseNode * dparse(D_Parser *ap,char *buf,int buf_len)

{
  SNode *sn_00;
  int iVar1;
  D_Scope *pDVar2;
  PNode *p_00;
  D_ParseNode *local_48;
  D_ParseNode *res;
  PNode *pn;
  SNode *sn;
  Parser *p;
  uint r;
  int buf_len_local;
  char *buf_local;
  D_Parser *ap_local;
  
  local_48 = (D_ParseNode *)0x0;
  *(undefined4 *)((long)&ap[1].free_node_fn + 4) = 0;
  *(undefined4 *)&ap[1].free_node_fn = 0;
  *(undefined4 *)((long)&ap[1].ambiguity_fn + 4) = 0;
  *(undefined4 *)&ap[1].ambiguity_fn = 0;
  *(undefined4 *)&ap[1].syntax_error_fn = 0;
  ap[1].initial_globals = buf;
  ap[1].initial_white_space_fn = (D_WhiteSpaceFn)(buf + buf_len);
  initialize_whitespace_parser((Parser *)ap);
  alloc_parser_working_data((Parser *)ap);
  if (ap->initial_scope == (D_Scope *)0x0) {
    if (ap[2].initial_white_space_fn != (D_WhiteSpaceFn)0x0) {
      free_D_Scope((D_Scope *)ap[2].initial_white_space_fn,0);
    }
    pDVar2 = new_D_Scope((D_Scope *)0x0);
    ap[2].initial_white_space_fn = (D_WhiteSpaceFn)pDVar2;
    *ap[2].initial_white_space_fn =
         (_func_void_D_Parser_ptr_d_loc_t_ptr_void_ptr_ptr)
         ((byte)*ap[2].initial_white_space_fn & 0xfc | 3);
  }
  else {
    ap[2].initial_white_space_fn = (D_WhiteSpaceFn)ap->initial_scope;
  }
  iVar1 = exhaustive_parse((Parser *)ap,ap->start_state);
  if (iVar1 == 0) {
    sn_00 = (SNode *)ap[2].initial_scope;
    if ((sn_00->zns).n == 1) {
      res = (D_ParseNode *)(*(sn_00->zns).v)->pn;
    }
    else {
      res = (D_ParseNode *)handle_top_level_ambiguities((Parser *)ap,sn_00);
    }
    p_00 = commit_tree((Parser *)ap,(PNode *)res);
    if (p_00 == (PNode *)0x0) {
      free_parser_working_data((Parser *)ap);
      free_whitespace_parser((Parser *)ap);
      return (D_ParseNode *)0x0;
    }
    if ((d_verbose_level != 0) &&
       (printf("%d states %d scans %d shifts %d reductions %d compares %d ambiguities\n",
               (ulong)*(uint *)&ap[1].syntax_error_fn,(ulong)*(uint *)&ap[1].ambiguity_fn,
               (ulong)*(uint *)((long)&ap[1].ambiguity_fn + 4),(ulong)*(uint *)&ap[1].free_node_fn,
               (ulong)*(uint *)((long)&ap[1].free_node_fn + 4),*(undefined4 *)&ap[1].loc.s),
       ap->save_parse_tree != 0)) {
      if (d_verbose_level < 2) {
        print_paren((Parser *)ap,p_00);
      }
      else {
        xprint_paren((Parser *)ap,p_00);
      }
      printf("\n");
    }
    if (ap->save_parse_tree == 0) {
      local_48 = (D_ParseNode *)0x1;
    }
    else {
      p_00->refcount = p_00->refcount + 1;
      local_48 = &p_00->parse_node;
    }
    iVar1 = *(int *)&(ap[2].initial_scope)->search + -1;
    *(int *)&(ap[2].initial_scope)->search = iVar1;
    if (iVar1 == 0) {
      free_SNode((Parser *)ap,(SNode *)ap[2].initial_scope);
    }
    ap[2].initial_scope = (D_Scope *)0x0;
  }
  else if (ap[2].initial_scope != (D_Scope *)0x0) {
    iVar1 = *(int *)&(ap[2].initial_scope)->search + -1;
    *(int *)&(ap[2].initial_scope)->search = iVar1;
    if (iVar1 == 0) {
      free_SNode((Parser *)ap,(SNode *)ap[2].initial_scope);
    }
    ap[2].initial_scope = (D_Scope *)0x0;
  }
  free_parser_working_data((Parser *)ap);
  free_whitespace_parser((Parser *)ap);
  return local_48;
}

Assistant:

D_ParseNode *dparse(D_Parser *ap, char *buf, int buf_len) {
  uint r;
  Parser *p = (Parser *)ap;
  SNode *sn;
  PNode *pn;
  D_ParseNode *res = NULL;

  p->states = p->scans = p->shifts = p->reductions = p->compares = 0;
  p->start = buf;
  p->end = buf + buf_len;

  initialize_whitespace_parser(p);
  alloc_parser_working_data(p);
  if (p->user.initial_scope)
    p->top_scope = p->user.initial_scope;
  else {
    if (p->top_scope) free_D_Scope(p->top_scope, 0);
    p->top_scope = new_D_Scope(NULL);
    p->top_scope->kind = D_SCOPE_SEQUENTIAL;
  }
  r = exhaustive_parse(p, p->user.start_state);
  if (!r) {
    sn = p->accept;
    if (sn->zns.n != 1)
      pn = handle_top_level_ambiguities(p, sn);
    else
      pn = sn->zns.v[0]->pn;
    pn = commit_tree(p, pn);
    if (!pn) {
      free_parser_working_data(p);
      free_whitespace_parser(p);
      return NULL;
    }
    if (d_verbose_level) {
      printf(
          "%d states %d scans %d shifts %d reductions "
          "%d compares %d ambiguities\n",
          p->states, p->scans, p->shifts, p->reductions, p->compares, p->ambiguities);
      if (p->user.save_parse_tree) {
        if (d_verbose_level > 1)
          xprint_paren(p, pn);
        else
          print_paren(p, pn);
        printf("\n");
      }
    }
    if (p->user.save_parse_tree) {
      ref_pn(pn);
      res = &pn->parse_node;
    } else
      res = NO_DPN;
    unref_sn(p, p->accept);
    p->accept = NULL;
  } else {
    if (p->accept) {
      unref_sn(p, p->accept);
      p->accept = NULL;
    }
  }
  free_parser_working_data(p);
  free_whitespace_parser(p);
  return res;
}